

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *param_1)

{
  undefined8 uVar1;
  float fVar2;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  (this->_attrib).has_value_ = (param_1->_attrib).has_value_;
  if ((param_1->_attrib).has_value_ == true) {
    uVar1 = *(undefined8 *)&(param_1->_attrib).contained;
    *(undefined8 *)((long)&(this->_attrib).contained + 6) =
         *(undefined8 *)((long)&(param_1->_attrib).contained + 6);
    *(undefined8 *)&(this->_attrib).contained = uVar1;
    ::std::
    vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
    ::vector((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
              *)((long)&(this->_attrib).contained + 0x10),
             (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
              *)((long)&(param_1->_attrib).contained + 0x10));
    *(undefined1 *)((long)&(this->_attrib).contained + 0x28) =
         *(undefined1 *)((long)&(param_1->_attrib).contained + 0x28);
  }
  this->_empty = param_1->_empty;
  fVar2 = (param_1->_fallback)._value.g;
  uVar1 = *(undefined8 *)((long)&(param_1->_fallback)._value.g + 2);
  (this->_fallback)._value.r = (param_1->_fallback)._value.r;
  (this->_fallback)._value.g = fVar2;
  *(undefined8 *)((long)&(this->_fallback)._value.g + 2) = uVar1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3f>::Sample>_>
  ::vector(&(this->_fallback)._ts._samples,&(param_1->_fallback)._ts._samples);
  (this->_fallback)._ts._dirty = (param_1->_fallback)._ts._dirty;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }